

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

bool __thiscall LiteScript::State::Finished(State *this)

{
  uint uVar1;
  size_type sVar2;
  const_reference this_00;
  bool local_11;
  State *this_local;
  
  uVar1 = this->instr_index;
  sVar2 = std::
          vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
          ::size(&this->instr);
  local_11 = false;
  if (sVar2 <= uVar1) {
    uVar1 = this->line_num;
    this_00 = std::
              vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
              ::operator[](&this->instr,(ulong)this->instr_index);
    sVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                      (this_00);
    local_11 = sVar2 <= uVar1;
  }
  return local_11;
}

Assistant:

bool LiteScript::State::Finished() const {
    return (this->instr_index >= this->instr.size() && this->line_num >= this->instr[this->instr_index].size());
}